

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemAloha.cpp
# Opt level: O2

void __thiscall ProblemAloha::SetOScopes(ProblemAloha *this)

{
  bool bVar1;
  Index i;
  ulong uVar2;
  Index yI1;
  Index y;
  Scope ySC;
  Scope aSC;
  allocator<char> local_b1;
  TwoStageDynamicBayesianNetwork *local_b0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  string local_50;
  
  local_b0 = &(this->super_FactoredDecPOMDPDiscrete).
              super_MultiAgentDecisionProcessDiscreteFactoredStates._m_2dbn;
  uVar2 = 0;
  while (i = (Index)uVar2,
        uVar2 < (this->super_FactoredDecPOMDPDiscrete).
                super_MultiAgentDecisionProcessDiscreteFactoredStates.
                super_MultiAgentDecisionProcess._m_nrAgents) {
    local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    Scope::Insert((Scope *)&local_88,i);
    uVar2 = 0;
    while (y = (Index)uVar2, uVar2 < this->_m_nrIslands) {
      bVar1 = areNeighbors(this,i,y);
      if (bVar1) {
        Scope::Insert((Scope *)&local_88,y);
      }
      uVar2 = (ulong)(y + 1);
    }
    Scope::Insert((Scope *)&local_a8,i);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"<>",&local_b1);
    Scope::Scope((Scope *)&local_68,&local_50);
    TwoStageDynamicBayesianNetwork::SetSoI_O
              (local_b0,i,(Scope *)&local_88,(Scope *)&local_a8,(Scope *)&local_68);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_68);
    std::__cxx11::string::~string((string *)&local_50);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_a8);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_88);
    uVar2 = (ulong)(i + 1);
  }
  return;
}

Assistant:

void ProblemAloha::SetOScopes()
{
    for(Index oI=0; oI < _m_nrAgents; oI++)
    {
        Scope aSC,ySC;

        aSC.Insert(oI);
        for(Index yI1=0; yI1 < _m_nrIslands; yI1++)
            if(areNeighbors(oI,yI1)) // and on your neighbors
                aSC.Insert(yI1);
        //ySC=aSC;
        ySC.Insert(oI);

        SetSoI_O( oI,
                  aSC,
                  ySC,
                  Scope("<>") // no interdependencies between next-stage Os
            );
    }
}